

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticks_linear.c
# Opt level: O3

void mpt_ticks_linear(mpt_dpoint *pts,size_t nt,double dx,double dy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  double dVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  double dVar13;
  
  if ((nt != 0) && (lVar5 = nt - 1, lVar5 != 0)) {
    dVar1 = pts->x;
    dVar2 = pts->y;
    auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = 0x45300000;
    dVar3 = pts[1].x;
    dVar4 = pts[1].y;
    dVar8 = (double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0;
    dVar11 = auVar9._8_8_ - 1.9342813113834067e+25;
    auVar7._8_8_ = dy;
    auVar7._0_8_ = dx;
    auVar10._0_8_ = dVar11 + dVar8;
    auVar10._8_8_ = dVar11 + dVar8;
    auVar7 = divpd(auVar7,auVar10);
    sVar6 = 1;
    do {
      auVar12._8_4_ = (int)(sVar6 >> 0x20);
      auVar12._0_8_ = sVar6;
      auVar12._12_4_ = 0x45300000;
      dVar8 = (double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0;
      dVar13 = auVar12._8_8_ - 1.9342813113834067e+25;
      dVar11 = (dVar13 + dVar8) * auVar7._0_8_;
      dVar8 = (dVar13 + dVar8) * auVar7._8_8_;
      pts->x = dVar1 + dVar11;
      pts->y = dVar2 + dVar8;
      pts[1].x = dVar11 + dVar3;
      pts[1].y = dVar8 + dVar4;
      pts = pts + 2;
      sVar6 = sVar6 + 1;
    } while (nt != sVar6);
  }
  return;
}

Assistant:

extern void mpt_ticks_linear(MPT_STRUCT(dpoint) *pts, size_t nt, double dx, double dy)
{
	double bx, by, tx, ty;
	size_t i;
	
	if (!nt--) {
		return;
	}
	/* tick base */
	bx = pts[0].x;
	by = pts[0].y;
	/* tick end */
	tx = pts[1].x;
	ty = pts[1].y;
	
	/* tick difference */
	dx = dx / nt;
	dy = dy / nt;
	
	/* set tick data */
	for (i = 1; i <= nt; i++) {
		double x = i * dx, y = i * dy;
		
		pts[0].x = bx + x;
		pts[0].y = by + y;
		pts[1].x = tx + x;
		pts[1].y = ty + y;
		
		pts += 2;
	}
}